

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

ON_MeshNGonEdge * __thiscall
ON_SimpleArray<ON_MeshNGonEdge>::AppendNew(ON_SimpleArray<ON_MeshNGonEdge> *this)

{
  ON_MeshNGonEdge *pOVar1;
  uint uVar2;
  int iVar3;
  ON_MeshNGonEdge *pOVar4;
  uint uVar5;
  
  uVar2 = this->m_count;
  if (uVar2 == this->m_capacity) {
    if (((int)uVar2 < 8) || ((ulong)((long)(int)uVar2 * 0x18) < 0x10000001)) {
      uVar5 = 4;
      if (2 < (int)uVar2) {
        uVar5 = uVar2 * 2;
      }
    }
    else {
      uVar5 = 0xaaaab2;
      if ((int)uVar2 < 0xaaaab2) {
        uVar5 = uVar2;
      }
      uVar5 = uVar5 + uVar2;
    }
    if ((uint)this->m_capacity < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
    }
  }
  pOVar4 = this->m_a;
  iVar3 = this->m_count;
  pOVar1 = pOVar4 + iVar3;
  pOVar1->m_sud_face_id = 0;
  pOVar1->m_mesh_Vi = 0;
  pOVar1->m_mesh_Vj = 0;
  pOVar1->m_u_status = '\0';
  *(undefined3 *)&pOVar1->field_0xd = 0;
  pOVar4[iVar3].m_u = (anon_union_8_2_07f07f9a_for_m_u)0x0;
  iVar3 = this->m_count;
  this->m_count = iVar3 + 1;
  return this->m_a + iVar3;
}

Assistant:

T& ON_SimpleArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int new_capacity = NewCapacity();
    Reserve( new_capacity );
  }
  memset( (void*)(&m_a[m_count]), 0, sizeof(T) );
  return m_a[m_count++];
}